

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_formatter.cpp
# Opt level: O0

string * __thiscall
bidfx_public_api::price::subject::SubjectFormatter::FormatSubjectComponents
          (string *__return_storage_ptr__,SubjectFormatter *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *components)

{
  ulong uVar1;
  bool bVar2;
  const_reference pvVar3;
  ostream *poVar4;
  size_type sVar5;
  string local_238;
  string local_218;
  ulong local_1f8;
  size_t i;
  stringstream ss;
  ostream local_1e0 [376];
  undefined1 local_68 [8];
  NumericCharacterEntity entity;
  allocator<char> local_21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *components_local;
  SubjectFormatter *this_local;
  
  local_20 = components;
  components_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local = (SubjectFormatter *)__return_storage_ptr__;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(components);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    NumericCharacterEntity::NumericCharacterEntity
              ((NumericCharacterEntity *)local_68,&this->numeric_character_entity_);
    std::__cxx11::stringstream::stringstream((stringstream *)&i);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(local_20,0);
    poVar4 = std::operator<<(local_1e0,(string *)pvVar3);
    poVar4 = std::operator<<(poVar4,'=');
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(local_20,1);
    std::operator<<(poVar4,(string *)pvVar3);
    local_1f8 = 2;
    while( true ) {
      uVar1 = local_1f8;
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_20);
      if (sVar5 <= uVar1) break;
      poVar4 = std::operator<<(local_1e0,',');
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(local_20,local_1f8);
      poVar4 = std::operator<<(poVar4,(string *)pvVar3);
      poVar4 = std::operator<<(poVar4,'=');
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(local_20,local_1f8 + 1);
      std::__cxx11::string::string((string *)&local_238,(string *)pvVar3);
      NumericCharacterEntity::EncodeString(&local_218,(NumericCharacterEntity *)local_68,&local_238)
      ;
      std::operator<<(poVar4,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_238);
      local_1f8 = local_1f8 + 2;
    }
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&i);
    NumericCharacterEntity::~NumericCharacterEntity((NumericCharacterEntity *)local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SubjectFormatter::FormatSubjectComponents(const std::vector<std::string>& components)
{
    if (components.empty())
    {
        return "";
    }

    NumericCharacterEntity entity = numeric_character_entity_;
    std::stringstream ss;

    ss << components.at(0) << KEY_VALUE_SEPARATOR << components.at(1);
    for (size_t i = 2; i < components.size(); i += 2)
    {
        ss << COMPONENT_SEPARATOR << components.at(i) << KEY_VALUE_SEPARATOR << entity.EncodeString(components.at(i + 1));
    }

    return ss.str();
}